

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O1

void __thiscall QWidgetPrivate::moveRect(QWidgetPrivate *this,QRect *rect,int dx,int dy)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  QWidget *this_00;
  QWidget *this_01;
  QWidgetPrivate *this_02;
  QWExtra *pQVar4;
  QRect QVar5;
  QRect QVar6;
  bool bVar7;
  char cVar8;
  QWidget *parent;
  QWidgetRepaintManager *this_03;
  QRegion *r;
  long in_FS_OFFSET;
  QRect QVar9;
  undefined1 auVar10 [16];
  QRegion parentRegion;
  QPoint toplevelOffset;
  QRegion childExpose;
  QRegion parentExpose;
  QRegion local_f0;
  QRegion local_e8;
  QRegion local_e0;
  undefined1 local_d8 [12];
  Representation RStack_cc;
  QRect local_c8;
  undefined1 local_b8 [12];
  Representation RStack_ac;
  QRect local_a8;
  undefined1 local_98 [24];
  QPoint local_80;
  QRegion local_78;
  double dStack_70;
  double local_68;
  double local_60;
  QRect local_58 [2];
  long local_38;
  
  QVar6._8_8_ = local_58[0]._8_8_;
  QVar6._0_8_ = local_58[0]._0_8_;
  QVar5._8_8_ = stack0xffffffffffffff50;
  QVar5._0_8_ = local_b8._0_8_;
  QVar9._8_8_ = stack0xffffffffffffff30;
  QVar9._0_8_ = local_d8._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((dy == 0 && dx == 0) ||
     (this_00 = *(QWidget **)&this->field_0x8, _local_d8 = QVar9, _local_b8 = QVar5,
     local_58[0] = QVar6, (this_00->data->widget_attributes & 0x8000) == 0)) goto LAB_0031a656;
  parent = QWidget::window(this_00);
  if (moveRect(QRect_const&,int,int)::accelEnv == '\0') {
    moveRect();
  }
  this_01 = *(QWidget **)(*(long *)&this_00->field_0x8 + 0x10);
  local_80 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  local_58[0].x1.m_i = 0;
  local_58[0].y1.m_i = 0;
  local_80 = QWidget::mapTo(this_01,parent,(QPoint *)local_58);
  this_02 = *(QWidgetPrivate **)&this_01->field_0x8;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._0_16_ = (undefined1  [16])clipRect(this_02);
  local_a8.x1.m_i = (rect->x1).m_i + dx;
  local_a8.x2.m_i = (rect->x2).m_i + dx;
  local_a8.y1.m_i = (rect->y1).m_i + dy;
  local_a8.y2.m_i = (rect->y2).m_i + dy;
  local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffff50 = &DAT_aaaaaaaaaaaaaaaa;
  _local_b8 = (QRect)QRect::operator&(rect,(QRect *)local_98);
  QVar9 = _local_b8;
  if ((int)local_b8._4_4_ <= RStack_ac.m_i && local_b8._0_4_.m_i <= local_b8._8_4_.m_i) {
    local_58[0].x1.m_i = local_b8._0_4_.m_i + dx;
    local_58[0].x2.m_i = local_b8._8_4_.m_i + dx;
    local_58[0].y1.m_i = local_b8._4_4_ + dy;
    local_58[0].y2.m_i = RStack_ac.m_i + dy;
    QVar9 = (QRect)QRect::operator&(local_58,(QRect *)local_98);
  }
  local_b8._0_4_ = QVar9.x1.m_i;
  local_b8._4_4_ = QVar9.y1.m_i;
  local_c8.x1.m_i = local_b8._0_4_ - dx;
  local_b8._8_4_ = QVar9.x2.m_i;
  local_c8.x2.m_i = local_b8._8_4_ - dx;
  RStack_ac = QVar9.y2.m_i;
  local_c8.y1.m_i = local_b8._4_4_ - dy;
  local_c8.y2.m_i = RStack_ac.m_i - dy;
  local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffff30 = &DAT_aaaaaaaaaaaaaaaa;
  _local_b8 = QVar9;
  _local_d8 = (QRect)QRect::operator&(rect,(QRect *)local_98);
  if ((this->field_0x253 & 2) == 0) {
    bVar7 = false;
  }
  else {
    bVar7 = hasPlatformWindow(this_00);
  }
  if ((moveRect::accelEnv == true) && (bVar7 == false && (this->field_0x252 & 2) != 0)) {
    if (local_c8.x2.m_i < local_c8.x1.m_i) goto LAB_0031a4b8;
    if ((local_c8.y2.m_i < local_c8.y1.m_i) ||
       (*(long *)(*(long *)(*(long *)&parent->field_0x8 + 0x78) + 0x10) != 0)) goto LAB_0031a4b8;
    bVar7 = isOverlapped(this,&local_c8);
    if (bVar7) goto LAB_0031a4b8;
    bVar7 = isOverlapped(this,(QRect *)local_b8);
    if (bVar7) goto LAB_0031a4b8;
    this_03 = maybeRepaintManager(*(QWidgetPrivate **)&parent->field_0x8);
    local_78.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    local_58[0] = (QRect)QRect::operator&(&local_a8,(QRect *)local_98);
    QRegion::QRegion(&local_78,local_58,Rectangle);
    bVar7 = QWidgetRepaintManager::bltRect((QWidgetRepaintManager *)this_03,&local_c8,dx,dy,this_01)
    ;
    if (bVar7) {
      QRegion::QRegion((QRegion *)local_58,(QRect *)local_b8,Rectangle);
      QRegion::operator-=(&local_78,(QRegion *)local_58);
      QRegion::~QRegion((QRegion *)local_58);
    }
    if ((this_01->data->widget_attributes & 0x400) == 0) {
      uVar3 = this_00->data->widget_attributes;
      if ((uVar3 >> 10 & 1) == 0) {
        cVar8 = QRegion::isEmpty();
        if (cVar8 == '\0') {
          QRegion::translate((int)&local_78,-(this->data).crect.x1.m_i);
          QWidgetRepaintManager::markDirty<QRegion>
                    ((QWidgetRepaintManager *)this_03,&local_78,this_00,UpdateLater,BufferValid);
          this->field_0x252 = this->field_0x252 | 0x20;
        }
      }
      local_58[0]._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion((QRegion *)local_58,(QRect *)local_d8,Rectangle);
      QRegion::QRegion(&local_e0,&local_a8,Rectangle);
      QRegion::operator-=((QRegion *)local_58,&local_e0);
      QRegion::~QRegion(&local_e0);
      pQVar4 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t
               .super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
      if ((pQVar4 != (QWExtra *)0x0) && ((pQVar4->field_0x7c & 0x80) != 0)) {
        QRegion::QRegion(&local_e8,&local_a8,Rectangle);
        QRegion::translated((int)&local_f0,
                            (int)(this->extra)._M_t.
                                 super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                                 super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                                 super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl + 0x40);
        QRegion::operator-(&local_e0,&local_e8);
        QRegion::operator+=((QRegion *)local_58,&local_e0);
        QRegion::~QRegion(&local_e0);
        QRegion::~QRegion(&local_f0);
        QRegion::~QRegion(&local_e8);
      }
      cVar8 = QRegion::isEmpty();
      if (cVar8 == '\0') {
        QWidgetRepaintManager::markDirty<QRegion>
                  ((QWidgetRepaintManager *)this_03,(QRegion *)local_58,this_01,UpdateLater,
                   BufferValid);
        this_02->field_0x252 = this_02->field_0x252 | 0x20;
      }
      if ((uVar3 >> 10 & 1) == 0) {
        local_e0.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        QRegion::QRegion(&local_e0,&local_c8,Rectangle);
        QRegion::operator+=(&local_e0,(QRect *)local_b8);
        QWidgetRepaintManager::markNeedsFlush
                  ((QWidgetRepaintManager *)this_03,this_01,&local_e0,&local_80);
        QRegion::~QRegion(&local_e0);
      }
      QRegion::~QRegion((QRegion *)local_58);
    }
    r = &local_78;
  }
  else {
LAB_0031a4b8:
    local_e0.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QVar9 = _local_d8;
    if (this->graphicsEffect != (QGraphicsEffect *)0x0) {
      bVar7 = QGraphicsEffect::isEnabled(this->graphicsEffect);
      QVar9 = _local_d8;
      if (bVar7) {
        local_78.d = (QRegionData *)(double)local_d8._0_4_.m_i;
        dStack_70 = (double)local_d8._4_4_.m_i;
        local_68 = (double)(((long)(int)local_d8._8_4_ - (long)local_d8._0_4_.m_i) + 1);
        local_60 = (double)(((long)RStack_cc.m_i - (long)local_d8._4_4_.m_i) + 1);
        (**(code **)(*(long *)this->graphicsEffect + 0x60))(local_58);
        QVar9 = (QRect)QRectF::toAlignedRect();
      }
    }
    local_58[0] = QVar9;
    QRegion::QRegion(&local_e0,local_58,Rectangle);
    pQVar4 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
             super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
    if ((pQVar4 == (QWExtra *)0x0) || ((pQVar4->field_0x7c & 0x80) == 0)) {
      QRegion::QRegion((QRegion *)local_58,&local_a8,Rectangle);
      QRegion::operator-=(&local_e0,(QRegion *)local_58);
      QRegion::~QRegion((QRegion *)local_58);
    }
    else {
      QVar9 = (QRect)QRect::operator&(&local_a8,(QRect *)local_98);
      local_58[0] = QVar9;
      QRegion::operator+=(&local_e0,local_58);
    }
    r = &local_e0;
    invalidateBackingStore<QRegion>(this_02,r);
    auVar10 = QRect::operator&(&local_a8,(QRect *)local_98);
    iVar1 = (this->data).crect.x1.m_i;
    iVar2 = (this->data).crect.y1.m_i;
    local_58[0].x1.m_i = auVar10._0_4_ - iVar1;
    local_58[0].x2.m_i = auVar10._8_4_ - iVar1;
    local_58[0].y1.m_i = auVar10._4_4_ - iVar2;
    local_58[0].y2.m_i = auVar10._12_4_ - iVar2;
    invalidateBackingStore<QRect>(this,local_58);
  }
  QRegion::~QRegion(r);
LAB_0031a656:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::moveRect(const QRect &rect, int dx, int dy)
{
    Q_Q(QWidget);
    if (!q->isVisible() || (dx == 0 && dy == 0))
        return;

    QWidget *tlw = q->window();

    static const bool accelEnv = qEnvironmentVariableIntValue("QT_NO_FAST_MOVE") == 0;

    QWidget *parentWidget = q->parentWidget();
    QPoint toplevelOffset = parentWidget->mapTo(tlw, QPoint());
    QWidgetPrivate *parentPrivate = parentWidget->d_func();
    const QRect clipR(parentPrivate->clipRect());
    const QRect newRect(rect.translated(dx, dy));
    QRect destRect = rect.intersected(clipR);
    if (destRect.isValid())
        destRect = destRect.translated(dx, dy).intersected(clipR);
    const QRect sourceRect(destRect.translated(-dx, -dy));
    const QRect parentRect(rect & clipR);
    const bool nativeWithTextureChild = textureChildSeen && hasPlatformWindow(q);

    bool accelerateMove = accelEnv && isOpaque && !nativeWithTextureChild && sourceRect.isValid()
#if QT_CONFIG(graphicsview)
                          // No accelerate move for proxy widgets.
                          && !tlw->d_func()->extra->proxyWidget
#endif
                          && !isOverlapped(sourceRect) && !isOverlapped(destRect);

    if (!accelerateMove) {
        QRegion parentRegion(effectiveRectFor(parentRect));
        if (!extra || !extra->hasMask) {
            parentRegion -= newRect;
        } else {
            // invalidateBackingStore() excludes anything outside the mask
            parentRegion += newRect & clipR;
        }
        parentPrivate->invalidateBackingStore(parentRegion);
        invalidateBackingStore((newRect & clipR).translated(-data.crect.topLeft()));
    } else {
        QWidgetRepaintManager *repaintManager = QWidgetPrivate::get(tlw)->maybeRepaintManager();
        Q_ASSERT(repaintManager);
        QRegion childExpose(newRect & clipR);

        if (repaintManager->bltRect(sourceRect, dx, dy, parentWidget))
            childExpose -= destRect;

        if (!parentWidget->updatesEnabled())
            return;

        const bool childUpdatesEnabled = q->updatesEnabled();

        if (childUpdatesEnabled && !childExpose.isEmpty()) {
            childExpose.translate(-data.crect.topLeft());
            repaintManager->markDirty(childExpose, q);
            isMoved = true;
        }

        QRegion parentExpose(parentRect);
        parentExpose -= newRect;
        if (extra && extra->hasMask)
            parentExpose += QRegion(newRect) - extra->mask.translated(data.crect.topLeft());

        if (!parentExpose.isEmpty()) {
            repaintManager->markDirty(parentExpose, parentWidget);
            parentPrivate->isMoved = true;
        }

        if (childUpdatesEnabled) {
            QRegion needsFlush(sourceRect);
            needsFlush += destRect;
            repaintManager->markNeedsFlush(parentWidget, needsFlush, toplevelOffset);
        }
    }
}